

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::initRep(SPxSolverBase<double> *this,Representation p_rep)

{
  SPxStatus SVar1;
  int iVar2;
  SVSetBase<double> *pSVar3;
  undefined4 extraout_var;
  Representation in_ESI;
  SPxSolverBase<double> *in_RDI;
  Desc *in_stack_00000098;
  SPxBasisBase<double> *in_stack_000000a0;
  SPxBasisBase<double> *in_stack_ffffffffffffffe0;
  
  in_RDI->theRep = in_ESI;
  if (in_RDI->theRep == COLUMN) {
    pSVar3 = LPColSetBase<double>::colSet
                       (&(in_RDI->super_SPxLPBase<double>).super_LPColSetBase<double>);
    in_RDI->thevectors = pSVar3;
    pSVar3 = LPRowSetBase<double>::rowSet((LPRowSetBase<double> *)in_RDI);
    in_RDI->thecovectors = pSVar3;
    in_RDI->theFrhs = &in_RDI->primRhs;
    in_RDI->theFvec = &in_RDI->primVec;
    in_RDI->theCoPrhs = &in_RDI->dualRhs;
    in_RDI->theCoPvec = &in_RDI->dualVec;
    in_RDI->thePvec = &in_RDI->addVec;
    in_RDI->theRPvec = in_RDI->theCoPvec;
    in_RDI->theCPvec = in_RDI->thePvec;
    in_RDI->theUbound = &in_RDI->theUCbound;
    in_RDI->theLbound = &in_RDI->theLCbound;
    in_RDI->theCoUbound = &in_RDI->theURbound;
    in_RDI->theCoLbound = &in_RDI->theLRbound;
  }
  else {
    pSVar3 = LPRowSetBase<double>::rowSet((LPRowSetBase<double> *)in_RDI);
    in_RDI->thevectors = pSVar3;
    pSVar3 = LPColSetBase<double>::colSet
                       (&(in_RDI->super_SPxLPBase<double>).super_LPColSetBase<double>);
    in_RDI->thecovectors = pSVar3;
    in_RDI->theFrhs = &in_RDI->dualRhs;
    in_RDI->theFvec = &in_RDI->dualVec;
    in_RDI->theCoPrhs = &in_RDI->primRhs;
    in_RDI->theCoPvec = &in_RDI->primVec;
    in_RDI->thePvec = &in_RDI->addVec;
    in_RDI->theRPvec = in_RDI->thePvec;
    in_RDI->theCPvec = in_RDI->theCoPvec;
    in_RDI->theUbound = &in_RDI->theURbound;
    in_RDI->theLbound = &in_RDI->theLRbound;
    in_RDI->theCoUbound = &in_RDI->theUCbound;
    in_RDI->theCoLbound = &in_RDI->theLCbound;
  }
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])();
  forceRecompNonbasicValue(in_RDI);
  SPxBasisBase<double>::setRep(in_stack_ffffffffffffffe0);
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (NO_PROBLEM < SVar1) {
    SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
    SPxBasisBase<double>::loadDesc(in_stack_000000a0,in_stack_00000098);
  }
  if (in_RDI->thepricer != (SPxPricer<double> *)0x0) {
    iVar2 = (*in_RDI->thepricer->_vptr_SPxPricer[3])();
    if ((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar2) == in_RDI) {
      (*in_RDI->thepricer->_vptr_SPxPricer[8])(in_RDI->thepricer,(ulong)(uint)in_ESI);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::initRep(Representation p_rep)
   {
      theRep = p_rep;

      if(theRep == COLUMN)
      {
         thevectors   = this->colSet();
         thecovectors = this->rowSet();
         theFrhs      = &primRhs;
         theFvec      = &primVec;
         theCoPrhs    = &dualRhs;
         theCoPvec    = &dualVec;
         thePvec      = &addVec;
         theRPvec     = theCoPvec;
         theCPvec     = thePvec;
         theUbound    = &theUCbound;
         theLbound    = &theLCbound;
         theCoUbound  = &theURbound;
         theCoLbound  = &theLRbound;
      }
      else
      {
         assert(theRep == ROW);

         thevectors   = this->rowSet();
         thecovectors = this->colSet();
         theFrhs      = &dualRhs;
         theFvec      = &dualVec;
         theCoPrhs    = &primRhs;
         theCoPvec    = &primVec;
         thePvec      = &addVec;
         theRPvec     = thePvec;
         theCPvec     = theCoPvec;
         theUbound    = &theURbound;
         theLbound    = &theLRbound;
         theCoUbound  = &theUCbound;
         theCoLbound  = &theLCbound;
      }

      unInit();
      reDim();

      forceRecompNonbasicValue();

      SPxBasisBase<R>::setRep();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::loadDesc(this->desc());

      if(thepricer && thepricer->solver() == this)
         thepricer->setRep(p_rep);
   }